

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceMgr.cpp
# Opt level: O3

void __thiscall
llvm::SourceMgr::PrintMessage
          (SourceMgr *this,raw_ostream *OS,SMDiagnostic *Diagnostic,bool ShowColors)

{
  SMLoc Loc;
  uint i;
  SrcBuffer *pSVar1;
  
  if (this->DiagHandler != (DiagHandlerTy)0x0) {
    (*this->DiagHandler)(Diagnostic,this->DiagContext);
    return;
  }
  Loc.Ptr = (Diagnostic->Loc).Ptr;
  if (Loc.Ptr != (char *)0x0) {
    i = FindBufferContainingLoc(this,Loc);
    if (i == 0) {
      __assert_fail("CurBuf && \"Invalid or unspecified location!\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/SourceMgr.cpp"
                    ,0xf0,
                    "void llvm::SourceMgr::PrintMessage(raw_ostream &, const SMDiagnostic &, bool) const"
                   );
    }
    pSVar1 = getBufferInfo(this,i);
    PrintIncludeStack(this,(SMLoc)(pSVar1->IncludeLoc).Ptr,OS);
  }
  SMDiagnostic::print(Diagnostic,(char *)0x0,OS,ShowColors,true);
  return;
}

Assistant:

void SourceMgr::PrintMessage(raw_ostream &OS, const SMDiagnostic &Diagnostic,
                             bool ShowColors) const {
  // Report the message with the diagnostic handler if present.
  if (DiagHandler) {
    DiagHandler(Diagnostic, DiagContext);
    return;
  }

  if (Diagnostic.getLoc().isValid()) {
    unsigned CurBuf = FindBufferContainingLoc(Diagnostic.getLoc());
    assert(CurBuf && "Invalid or unspecified location!");
    PrintIncludeStack(getBufferInfo(CurBuf).IncludeLoc, OS);
  }

  Diagnostic.print(nullptr, OS, ShowColors);
}